

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

void __thiscall TPZFMatrix<Fad<float>_>::InitializePivot(TPZFMatrix<Fad<float>_> *this)

{
  int *piVar1;
  long lVar2;
  long newsize;
  
  newsize = (long)(int)(this->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow;
  TPZManVector<int,_5>::Resize(&this->fPivot,newsize);
  piVar1 = (this->fPivot).super_TPZVec<int>.fStore;
  lVar2 = 0;
  if (newsize < 1) {
    newsize = lVar2;
  }
  while (newsize != lVar2) {
    piVar1[lVar2] = (int)(lVar2 + 1);
    lVar2 = lVar2 + 1;
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::InitializePivot()
{
    const int nRows = this->Rows();
    fPivot.Resize(nRows);
    for(int64_t i = 0; i < nRows; i++){
        fPivot[i] = i+1; // Fortran based indexing
    }
}